

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Type.cxx
# Opt level: O0

void __thiscall Fl_Menu_Type::copy_properties(Fl_Menu_Type *this)

{
  Fl_Menu_ *this_00;
  Fl_Menu_ *this_01;
  Fl_Boxtype b;
  Fl_Color c;
  Fl_Font c_00;
  Fl_Fontsize c_01;
  Fl_Menu_Item *m;
  Fl_Menu_ *d;
  Fl_Menu_ *s;
  Fl_Menu_Type *this_local;
  
  Fl_Widget_Type::copy_properties(&this->super_Fl_Widget_Type);
  this_00 = (Fl_Menu_ *)(this->super_Fl_Widget_Type).o;
  this_01 = (Fl_Menu_ *)(this->super_Fl_Widget_Type).live_widget;
  m = Fl_Menu_::menu(this_00);
  Fl_Menu_::menu(this_01,m);
  b = Fl_Menu_::down_box(this_00);
  Fl_Menu_::down_box(this_01,b);
  c = Fl_Menu_::textcolor(this_00);
  Fl_Menu_::textcolor(this_01,c);
  c_00 = Fl_Menu_::textfont(this_00);
  Fl_Menu_::textfont(this_01,c_00);
  c_01 = Fl_Menu_::textsize(this_00);
  Fl_Menu_::textsize(this_01,c_01);
  return;
}

Assistant:

void Fl_Menu_Type::copy_properties() {
  Fl_Widget_Type::copy_properties();
  Fl_Menu_ *s = (Fl_Menu_*)o, *d = (Fl_Menu_*)live_widget;
  d->menu(s->menu());
  d->down_box(s->down_box());
  d->textcolor(s->textcolor());
  d->textfont(s->textfont());
  d->textsize(s->textsize());
}